

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O2

void __thiscall helics::CoreApp::CoreApp(CoreApp *this,string_view argString)

{
  element_type *peVar1;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> this_00;
  ParseOutput PVar2;
  int iVar3;
  size_type sVar4;
  undefined4 extraout_var;
  allocator<char> local_61;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> local_60;
  string_view argString_local;
  string_view in_stack_ffffffffffffffb8;
  
  argString_local._M_str = argString._M_str;
  argString_local._M_len = argString._M_len;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&argString_local,'-',0);
  if (sVar4 == 0xffffffffffffffff) {
    CoreFactory::findCore(in_stack_ffffffffffffffb8);
    std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffb8);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
    peVar1 = (this->core).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar3 = (*peVar1->_vptr_Core[0xc])();
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&this->name,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(extraout_var,iVar3));
      return;
    }
  }
  generateParser((CoreApp *)&local_60);
  this_00._M_head_impl = local_60._M_head_impl;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&stack0xffffffffffffffb8,&argString_local,&local_61);
  PVar2 = helicsCLI11App::helics_parse<std::__cxx11::string>
                    (this_00._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  if (PVar2 == OK) {
    processArgs(this,(unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                      *)&local_60);
  }
  if (local_60._M_head_impl != (helicsCLI11App *)0x0) {
    (*((local_60._M_head_impl)->super_App)._vptr_App[1])();
  }
  return;
}

Assistant:

CoreApp::CoreApp(std::string_view argString)
{
    if (argString.find_first_of('-') == std::string::npos) {
        core = CoreFactory::findCore(argString);
        if (core) {
            name = core->getIdentifier();
            return;
        }
    }
    auto app = generateParser();
    if (app->helics_parse(std::string{argString}) == helicsCLI11App::ParseOutput::OK) {
        processArgs(app);
    }
}